

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O3

LCC_API_VIRTUALIZATION_DETAIL __thiscall
license::os::ExecutionEnvironment::virtualization_detail(ExecutionEnvironment *this)

{
  pointer pcVar1;
  bool bVar2;
  LCC_API_VIRTUALIZATION_DETAIL LVar3;
  LCC_API_CLOUD_PROVIDER LVar4;
  string sys_vendor;
  string bios_vendor;
  string bios_description;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar1 = (this->m_dmi_info).m_bios_description._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,
             pcVar1 + (this->m_dmi_info).m_bios_description._M_string_length);
  pcVar1 = (this->m_dmi_info).m_bios_vendor._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->m_dmi_info).m_bios_vendor._M_string_length);
  pcVar1 = (this->m_dmi_info).m_sys_vendor._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (this->m_dmi_info).m_sys_vendor._M_string_length);
  LVar3 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                       *)vm_vendors_abi_cxx11_._16_8_,&local_48);
  if (LVar3 == BARE_TO_METAL) {
    LVar3 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                         *)vm_vendors_abi_cxx11_._16_8_,&local_68);
    if (LVar3 == BARE_TO_METAL) {
      LVar3 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                           *)vm_vendors_abi_cxx11_._16_8_,&local_88);
      if (LVar3 == BARE_TO_METAL) {
        LVar3 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                             *)virtual_cpu_names_abi_cxx11_._16_8_,&(this->m_cpu_info).m_vendor);
        if (LVar3 == BARE_TO_METAL) {
          LVar3 = find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                               *)virtual_cpu_names_abi_cxx11_._16_8_,&(this->m_cpu_info).m_brand);
          if (LVar3 == BARE_TO_METAL) {
            bVar2 = CpuInfo::is_hypervisor_set(&this->m_cpu_info);
            if (!bVar2) {
              LVar4 = cloud_provider(this);
              LVar3 = BARE_TO_METAL;
              if (LVar4 < GOOGLE_CLOUD) goto LAB_0011dd6b;
            }
            LVar3 = PRODUCT_EXPIRED;
          }
        }
      }
    }
  }
LAB_0011dd6b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return LVar3;
}

Assistant:

LCC_API_VIRTUALIZATION_DETAIL ExecutionEnvironment::virtualization_detail() const {
	LCC_API_VIRTUALIZATION_DETAIL result = BARE_TO_METAL;
	const string bios_description = m_dmi_info.bios_description();
	const string bios_vendor = m_dmi_info.bios_vendor();
	const string sys_vendor = m_dmi_info.sys_vendor();
	if ((result = find_in_map(vm_vendors, bios_description)) == BARE_TO_METAL) {
		if ((result = find_in_map(vm_vendors, bios_vendor)) == BARE_TO_METAL) {
			if ((result = find_in_map(vm_vendors, sys_vendor)) == BARE_TO_METAL) {
				if ((result = find_in_map(virtual_cpu_names, m_cpu_info.vendor())) == BARE_TO_METAL) {
					result = find_in_map(virtual_cpu_names, m_cpu_info.brand());
				}
			}
		}
	}
	if (result == BARE_TO_METAL) {
		if (m_cpu_info.is_hypervisor_set() || is_cloud()) {
			result = V_OTHER;
		}
	}
	return result;
}